

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::checkForgotSubst(CheckerVisitor *this,LiteralExpr *l)

{
  CallExpr *this_00;
  bool bVar1;
  LiteralKind LVar2;
  TreeOp TVar3;
  int iVar4;
  size_type_conflict sVar5;
  pointer pSVar6;
  Node *this_01;
  ArenaVector<SQCompilation::Expr_*> *this_02;
  GetFieldExpr *this_03;
  SQChar *pSVar7;
  LiteralExpr *pLVar8;
  Id *this_04;
  LiteralExpr *in_RSI;
  CheckerVisitor *in_RDI;
  SQChar *funcName;
  GetFieldExpr *f;
  ArenaVector<SQCompilation::Expr_*> *arguments;
  Expr *callee;
  bool ok;
  SQChar *s;
  Node *n;
  reverse_iterator it;
  CallExpr *candidate;
  Expr *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  CallExpr *local_18;
  
  if (((in_RDI->effectsOnly & 1U) == 0) && (LVar2 = LiteralExpr::kind(in_RSI), LVar2 == LK_STRING))
  {
    local_18 = (CallExpr *)0x0;
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::rbegin((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)in_RDI);
    while( true ) {
      std::
      vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
      ::rend((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)in_RDI);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff97,
                                          CONCAT16(in_stack_ffffffffffffff96,
                                                   in_stack_ffffffffffffff90)),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                               *)in_stack_ffffffffffffff88);
      this_00 = local_18;
      if (!bVar1) break;
      pSVar6 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90
                                                )));
      if (pSVar6->sst == SST_NODE) {
        pSVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff97,
                                          CONCAT16(in_stack_ffffffffffffff96,
                                                   in_stack_ffffffffffffff90)));
        this_00 = (CallExpr *)(pSVar6->field_1).n;
        TVar3 = Node::op((Node *)this_00);
        if (TVar3 == TO_CALL) break;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    }
    local_18 = this_00;
    LiteralExpr::s(in_RSI);
    bVar1 = stringLooksLikeFormatTemplate((SQChar *)in_RDI);
    if (bVar1) {
      bVar1 = false;
      if (local_18 != (CallExpr *)0x0) {
        CallExpr::callee(local_18);
        this_01 = &deparen(in_stack_ffffffffffffff88)->super_Node;
        this_02 = CallExpr::arguments(local_18);
        TVar3 = Node::op(this_01);
        if (TVar3 == TO_GETFIELD) {
          this_03 = Node::asGetField(this_01);
          pSVar7 = FieldAccessExpr::fieldName(&this_03->super_FieldAccessExpr);
          AccessExpr::receiver((AccessExpr *)this_03);
          pLVar8 = (LiteralExpr *)deparen(in_stack_ffffffffffffff88);
          if (pLVar8 == in_RSI) {
            iVar4 = strcmp(pSVar7,"subst");
            bVar1 = iVar4 == 0;
          }
          else {
            iVar4 = strcmp(pSVar7,"split");
            if (iVar4 == 0) {
              sVar5 = ArenaVector<SQCompilation::Expr_*>::size(this_02);
              bVar1 = false;
              if (sVar5 != 0) {
                ArenaVector<SQCompilation::Expr_*>::operator[](this_02,0);
                pLVar8 = (LiteralExpr *)deparen(in_stack_ffffffffffffff88);
                bVar1 = pLVar8 == in_RSI;
              }
            }
          }
        }
        else {
          TVar3 = Node::op(this_01);
          if (TVar3 == TO_ID) {
            this_04 = Node::asId(this_01);
            pSVar7 = Id::id(this_04);
            iVar4 = strcmp("loc",pSVar7);
            if (iVar4 == 0) {
              sVar5 = ArenaVector<SQCompilation::Expr_*>::size(this_02);
              bVar1 = false;
              if (1 < sVar5) {
                ArenaVector<SQCompilation::Expr_*>::operator[](this_02,1);
                pLVar8 = (LiteralExpr *)deparen(in_stack_ffffffffffffff88);
                bVar1 = pLVar8 == in_RSI;
              }
            }
          }
        }
      }
      if (!bVar1) {
        report(in_RDI,(Node *)in_RSI,0x6f);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkForgotSubst(const LiteralExpr *l) {
  if (effectsOnly)
    return;

  if (l->kind() != LK_STRING)
    return;

  const CallExpr *candidate = nullptr;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    const Node *n = it->n;

    if (n->op() == TO_CALL) {
      candidate = static_cast<const CallExpr *>(n);
      break;
    }
  }

  const SQChar *s = l->s();
  if (!stringLooksLikeFormatTemplate(s)) {
    return;
  }

  bool ok = false;

  if (candidate) {
    const Expr *callee = deparen(candidate->callee());
    const auto &arguments = candidate->arguments();
    if (callee->op() == TO_GETFIELD) { // -V522
      const GetFieldExpr *f = callee->asGetField();
      const SQChar *funcName = f->fieldName();
      if (deparen(f->receiver()) == l) {
        ok = strcmp(funcName, "subst") == 0;
      } else if (strcmp(funcName, "split") == 0) {
        ok = arguments.size() >= 1 && deparen(arguments[0]) == l;;
      }
    }
    else if (callee->op() == TO_ID) { // -V522
      if (strcmp("loc", callee->asId()->id()) == 0) {
        ok = arguments.size() >= 2 && deparen(arguments[1]) == l;
      }
    }
  }

  if (!ok)
    report(l, DiagnosticsId::DI_FORGOT_SUBST);
}